

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void changeLpMatrixCoefficient
               (HighsLp *lp,HighsInt row,HighsInt col,double new_value,bool zero_new_value)

{
  vector<int,_std::allocator<int>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  lVar10 = (long)col;
  piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)piVar3[lVar10];
  uVar8 = piVar3[lVar10 + 1];
  if (piVar3[lVar10] < (int)uVar8) {
    piVar5 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (piVar5[uVar9] == row) {
        if (-1 < (long)uVar9) {
          if (zero_new_value) {
            iVar2 = piVar3[lp->num_col_];
            if (col < lp->num_col_) {
              do {
                piVar3[lVar10 + 1] = piVar3[lVar10 + 1] + -1;
                lVar10 = lVar10 + 1;
              } while (lVar10 < lp->num_col_);
            }
            if (iVar2 + -1 <= (int)uVar9) {
              return;
            }
            pdVar4 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar7 = uVar9 & 0xffffffff;
            do {
              uVar6 = uVar7 + 1;
              piVar5[uVar7] = piVar5[uVar6];
              pdVar4[uVar7] = pdVar4[uVar6];
              uVar8 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar8;
              uVar7 = uVar6;
            } while ((int)uVar8 < iVar2 + -1);
            return;
          }
          goto LAB_0024173a;
        }
        break;
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != (uint)uVar9);
  }
  if (!zero_new_value) {
    iVar2 = piVar3[lp->num_col_];
    lVar11 = (long)iVar2;
    this = &(lp->a_matrix_).index_;
    std::vector<int,_std::allocator<int>_>::resize(this,lVar11 + 1U);
    this_00 = &(lp->a_matrix_).value_;
    std::vector<double,_std::allocator<double>_>::resize(this_00,lVar11 + 1U);
    if (col < lp->num_col_) {
      piVar3 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        piVar1 = piVar3 + lVar10 + 1;
        *piVar1 = *piVar1 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar10 < lp->num_col_);
    }
    piVar5 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((int)uVar8 < iVar2) {
      pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        piVar5[lVar11] = piVar5[lVar11 + -1];
        pdVar4[lVar11] = pdVar4[lVar11 + -1];
        lVar11 = lVar11 + -1;
      } while ((int)uVar8 < lVar11);
    }
    uVar9 = (ulong)uVar8;
LAB_0024173a:
    piVar5[(int)uVar9] = row;
    (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar9] = new_value;
  }
  return;
}

Assistant:

void changeLpMatrixCoefficient(HighsLp& lp, const HighsInt row,
                               const HighsInt col, const double new_value,
                               const bool zero_new_value) {
  assert(0 <= row && row < lp.num_row_);
  assert(0 <= col && col < lp.num_col_);

  // Determine whether the coefficient corresponds to an existing
  // nonzero
  HighsInt change_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[col];
       el < lp.a_matrix_.start_[col + 1]; el++) {
    if (lp.a_matrix_.index_[el] == row) {
      change_el = el;
      break;
    }
  }
  if (change_el < 0) {
    // Coefficient doesn't correspond to an existing nonzero
    //
    // If coefficient is small, then just ignore it
    if (zero_new_value) return;
    // New nonzero goes at the end of column "col", so have to shift
    // all index and value entries forward by 1 to accommodate it
    change_el = lp.a_matrix_.start_[col + 1];
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] + 1;
    lp.a_matrix_.index_.resize(new_num_nz);
    lp.a_matrix_.value_.resize(new_num_nz);
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]++;
    for (HighsInt el = new_num_nz - 1; el > change_el; el--) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el - 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el - 1];
    }
  } else if (zero_new_value) {
    // Coefficient zeroes an existing nonzero, so shift all index and
    // value entries backward by 1 to eliminate it
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] - 1;
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]--;
    for (HighsInt el = change_el; el < new_num_nz; el++) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el + 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el + 1];
    }
    return;
  }
  lp.a_matrix_.index_[change_el] = row;
  lp.a_matrix_.value_[change_el] = new_value;
}